

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::TestSpec::Pattern> * __thiscall
Catch::Ptr<Catch::TestSpec::Pattern>::operator=(Ptr<Catch::TestSpec::Pattern> *this,Pattern *p)

{
  Pattern *in_RDI;
  Ptr<Catch::TestSpec::Pattern> temp;
  Ptr<Catch::TestSpec::Pattern> *this_00;
  Ptr<Catch::TestSpec::Pattern> local_18 [3];
  
  this_00 = local_18;
  Ptr(this_00,in_RDI);
  swap(this_00,(Ptr<Catch::TestSpec::Pattern> *)in_RDI);
  ~Ptr(this_00);
  return (Ptr<Catch::TestSpec::Pattern> *)in_RDI;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }